

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JsEval.c
# Opt level: O3

void Arguments_eval(JsAstNode *na,JsContext *context,JsValue *res)

{
  JsLocation *pJVar1;
  undefined1 local_48 [8];
  JsValue v;
  
  pJVar1 = na[1].location;
  if (pJVar1 != (JsLocation *)0x0) {
    do {
      (*JsNodeClassEval[((JsAstNode *)pJVar1->filename)->astClass])
                ((JsAstNode *)pJVar1->filename,context,(JsValue *)local_48);
      JsGetValue((JsValue *)local_48,res);
      res = res + 1;
      pJVar1 = *(JsLocation **)&pJVar1->lineno;
    } while (pJVar1 != (JsLocation *)0x0);
  }
  return;
}

Assistant:

static void
Arguments_eval(na, context, res)
	struct JsAstNode *na; /* (struct Arguments_node) */
	struct JsContext *context;
	struct JsValue *res;		/* Assumed pointer to array */
{
	struct JsAstArgumentsNode *n = CAST_NODE(na, JsAstArgumentsNode);
	struct JsAstArgumentsArg *arg;
	struct JsValue v;

	for (arg = n->first; arg; arg = arg->next) {
		EVAL(arg->expr, context, &v);
		JsGetValue( &v, res);
		res++;
	}
}